

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O2

void __thiscall FPatchTexture::MakeTexture(FPatchTexture *this)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  BYTE *pBVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  FMemLump FVar12;
  BYTE *__dest;
  ushort uVar13;
  FMemLump lump;
  BYTE remaptable [256];
  
  FWadCollection::ReadLump((FWadCollection *)&lump,0xa07390);
  FVar12.Block.Chars = (FString)(FString)(char *)0x0;
  if (*(int *)((long)lump.Block.Chars + -0xc) != 0) {
    FVar12 = lump;
  }
  iVar3 = FWadCollection::LumpLength(&Wads,(this->super_FTexture).SourceLump);
  if (((this->super_FTexture).field_0x31 & 2) == 0) {
    __dest = GPalette.Remap;
  }
  else {
    __dest = remaptable;
    memcpy(__dest,GPalette.Remap,0x100);
    remaptable[0] = '\0';
  }
  uVar13 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  if (this->hackflag == true) {
    pBVar4 = (BYTE *)operator_new__((ulong)uVar2 * (ulong)uVar13);
    this->Pixels = pBVar4;
    for (uVar5 = 0; uVar5 < uVar13; uVar5 = uVar5 + 1) {
      pbVar6 = (byte *)((long)FVar12.Block.Chars +
                       (ulong)*(uint *)((long)FVar12.Block.Chars + uVar5 * 4 + 8) + 3);
      for (uVar7 = (uint)(this->super_FTexture).Height; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        *pBVar4 = __dest[*pbVar6];
        pBVar4 = pBVar4 + 1;
        pbVar6 = pbVar6 + 1;
      }
      uVar13 = (this->super_FTexture).Width;
    }
  }
  else {
    uVar5 = (ulong)(int)((uVar13 - 1) * (uint)uVar2 +
                        (1 << ((this->super_FTexture).HeightBits & 0x1f)));
    pBVar4 = (BYTE *)operator_new__(uVar5);
    this->Pixels = pBVar4;
    memset(pBVar4,0,uVar5);
    for (uVar5 = 0; uVar5 < uVar13; uVar5 = uVar5 + 1) {
      uVar13 = (this->super_FTexture).Height;
      pBVar4 = this->Pixels;
      uVar7 = 0xffffffff;
      for (pbVar6 = (byte *)((long)FVar12.Block.Chars +
                            (ulong)*(uint *)((long)FVar12.Block.Chars + uVar5 * 4 + 8));
          (pbVar6 < (byte *)((long)FVar12.Block.Chars + (long)iVar3 + -3) &&
          (bVar1 = *pbVar6, bVar1 != 0xff)); pbVar6 = pbVar6 + (ulong)uVar8 + 4) {
        uVar8 = 0;
        if ((int)uVar7 < (int)(uint)bVar1) {
          uVar7 = uVar8;
        }
        uVar7 = uVar7 + bVar1;
        bVar1 = pbVar6[1];
        if (bVar1 != 0) {
          uVar11 = (uint)(this->super_FTexture).Height;
          uVar8 = (uint)bVar1;
          uVar9 = uVar11 - uVar7;
          if ((int)(uVar7 + bVar1) <= (int)uVar11) {
            uVar9 = uVar8;
          }
          if (0 < (int)uVar9) {
            for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
              pBVar4[uVar10 + (long)(int)uVar7 + uVar13 * uVar5] = __dest[pbVar6[uVar10 + 3]];
            }
            uVar8 = (uint)pbVar6[1];
          }
        }
      }
      uVar13 = (this->super_FTexture).Width;
    }
  }
  FMemLump::~FMemLump(&lump);
  return;
}

Assistant:

void FPatchTexture::MakeTexture ()
{
	BYTE *remap, remaptable[256];
	int numspans;
	const column_t *maxcol;
	int x;

	FMemLump lump = Wads.ReadLump (SourceLump);
	const patch_t *patch = (const patch_t *)lump.GetMem();

	maxcol = (const column_t *)((const BYTE *)patch + Wads.LumpLength (SourceLump) - 3);

	// Check for badly-sized patches
#if 0	// Such textures won't be created so there's no need to check here
	if (LittleShort(patch->width) <= 0 || LittleShort(patch->height) <= 0)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s has a non-positive size.\n", Name);
	}
	else if (LittleShort(patch->width) > 2048 || LittleShort(patch->height) > 2048)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s is too big.\n", Name);
	}
#endif

	if (bNoRemap0)
	{
		memcpy (remaptable, GPalette.Remap, 256);
		remaptable[0] = 0;
		remap = remaptable;
	}
	else
	{
		remap = GPalette.Remap;
	}


	if (hackflag)
	{
		Pixels = new BYTE[Width * Height];
		BYTE *out;

		// Draw the image to the buffer
		for (x = 0, out = Pixels; x < Width; ++x)
		{
			const BYTE *in = (const BYTE *)patch + LittleLong(patch->columnofs[x]) + 3;

			for (int y = Height; y > 0; --y)
			{
				*out = remap[*in];
				out++, in++;
			}
		}
		return;
	}

	// Add a little extra space at the end if the texture's height is not
	// a power of 2, in case somebody accidentally makes it repeat vertically.
	int numpix = Width * Height + (1 << HeightBits) - Height;

	numspans = Width;

	Pixels = new BYTE[numpix];
	memset (Pixels, 0, numpix);

	// Draw the image to the buffer
	for (x = 0; x < Width; ++x)
	{
		BYTE *outtop = Pixels + x*Height;
		const column_t *column = (const column_t *)((const BYTE *)patch + LittleLong(patch->columnofs[x]));
		int top = -1;

		while (column < maxcol && column->topdelta != 0xFF)
		{
			if (column->topdelta <= top)
			{
				top += column->topdelta;
			}
			else
			{
				top = column->topdelta;
			}

			int len = column->length;
			BYTE *out = outtop + top;

			if (len != 0)
			{
				if (top + len > Height)	// Clip posts that extend past the bottom
				{
					len = Height - top;
				}
				if (len > 0)
				{
					numspans++;

					const BYTE *in = (const BYTE *)column + 3;
					for (int i = 0; i < len; ++i)
					{
						out[i] = remap[in[i]];
					}
				}
			}
			column = (const column_t *)((const BYTE *)column + column->length + 4);
		}
	}
}